

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

void Abc_CexPrintStats(Abc_Cex_t *p)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  ulong in_XMM9_Qa;
  uint uVar11;
  undefined8 in_XMM9_Qb;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM13 [16];
  uint uVar17;
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    return;
  }
  if (p == (Abc_Cex_t *)0x1) {
    puts("The counter example is present but not available (pointer has value \"1\").");
    return;
  }
  uVar1 = p->nBits;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  else {
    iVar3 = uVar1 - 1;
    auVar5._4_4_ = iVar3;
    auVar5._0_4_ = iVar3;
    auVar5._8_4_ = iVar3;
    auVar5._12_4_ = iVar3;
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_007ee2e0;
    auVar9 = _DAT_007f4540;
    auVar7 = (undefined1  [16])0x0;
    do {
      auVar13 = auVar7;
      auVar7 = auVar9 ^ _DAT_007ee2e0;
      auVar8._0_4_ = -(uint)(auVar5._0_4_ < auVar7._0_4_);
      auVar8._4_4_ = -(uint)(auVar5._4_4_ < auVar7._4_4_);
      auVar8._8_4_ = -(uint)(auVar5._8_4_ < auVar7._8_4_);
      auVar8._12_4_ = -(uint)(auVar5._12_4_ < auVar7._12_4_);
      if ((~auVar8._0_4_ & 1) != 0) {
        in_XMM9_Qa = (ulong)(uint)(&p[1].iPo)[uVar4 >> 5];
        in_XMM9_Qb = 0;
      }
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar14 = auVar8 ^ auVar15;
      if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        in_XMM9_Qa = CONCAT44((&p[1].iPo)[uVar4 >> 5],(int)in_XMM9_Qa);
      }
      uVar10 = (uint)in_XMM9_Qa;
      if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        in_XMM9_Qb = CONCAT44((int)((ulong)in_XMM9_Qb >> 0x20),(&p[1].iPo)[uVar4 >> 5]);
      }
      if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar14._4_4_ = 0;
        auVar14._0_4_ = (&p[1].iPo)[uVar4 >> 5];
        auVar14._8_4_ = (int)in_XMM9_Qb;
        auVar14._12_4_ = (int)((ulong)in_XMM9_Qb >> 0x20);
        in_XMM9_Qb = CONCAT44((&p[1].iPo)[uVar4 >> 5],(int)in_XMM9_Qb);
      }
      auVar7 = auVar9 & _DAT_007f4550;
      auVar15 = pshuflw(auVar14,auVar7,0xfe);
      uVar2 = in_XMM9_Qa >> 0x20;
      auVar14 = pshuflw(in_XMM13,auVar7,0x54);
      uVar12 = (uint)((ulong)in_XMM9_Qb >> 0x20);
      auVar16._8_4_ = auVar7._8_4_;
      auVar16._12_4_ = auVar7._12_4_;
      auVar16._0_8_ = auVar7._8_8_;
      in_XMM13 = pshuflw(auVar14,auVar16,0xfe);
      uVar17 = uVar12 >> in_XMM13._0_8_;
      auVar7 = pshuflw(auVar16,auVar16,0x54);
      uVar11 = (uint)in_XMM9_Qb >> auVar7._0_8_;
      in_XMM9_Qa = CONCAT44(uVar12 >> auVar7._0_8_,uVar11);
      in_XMM9_Qb = CONCAT44(uVar17,(uint)in_XMM9_Qb >> in_XMM13._0_8_);
      auVar7._0_4_ = (uVar10 >> auVar14._0_8_ & 1) + auVar13._0_4_;
      auVar7._4_4_ = ((uint)uVar2 >> auVar15._0_8_ & 1) + auVar13._4_4_;
      auVar7._8_4_ = (uVar11 & 1) + auVar13._8_4_;
      auVar7._12_4_ = (uVar17 & 1) + auVar13._12_4_;
      uVar4 = uVar4 + 4;
      auVar6._0_4_ = auVar9._0_4_ + 4;
      auVar6._4_4_ = auVar9._4_4_ + 4;
      auVar6._8_4_ = auVar9._8_4_ + 4;
      auVar6._12_4_ = auVar9._12_4_ + 4;
      auVar9 = auVar6;
    } while ((uVar1 + 3 & 0xfffffffc) != uVar4);
    auVar9 = ~auVar8 & auVar7 | auVar13 & auVar8;
    uVar2 = (ulong)(uint)(auVar9._12_4_ + auVar9._4_4_ + auVar9._8_4_ + auVar9._0_4_);
  }
  printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%)\n",
         ((double)(int)uVar2 * 100.0) / (double)(int)(uVar1 - p->nRegs),(ulong)(uint)p->iPo,
         (ulong)(uint)p->iFrame,(ulong)(uint)p->nRegs,(ulong)(uint)p->nPis,(ulong)uVar1,uVar2);
  return;
}

Assistant:

void Abc_CexPrintStats( Abc_Cex_t * p )
{
    int k, Counter = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
        Counter += Abc_InfoHasBit(p->pData, k);
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter, 100.0 * Counter / (p->nBits - p->nRegs) );
}